

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Match_Size(FT_Face face,FT_Size_Request req,FT_Bool ignore_width,FT_ULong *size_index)

{
  ulong uVar1;
  FT_Bitmap_Size *local_60;
  FT_Bitmap_Size *local_58;
  FT_Bitmap_Size *bsize;
  FT_Long h;
  FT_Long w;
  FT_Int i;
  FT_ULong *size_index_local;
  FT_Bool ignore_width_local;
  FT_Size_Request req_local;
  FT_Face face_local;
  
  if ((face->face_flags & 2U) == 0) {
    face_local._4_4_ = 0x23;
  }
  else if (req->type == FT_SIZE_REQUEST_TYPE_NOMINAL) {
    if (req->horiResolution == 0) {
      local_58 = (FT_Bitmap_Size *)req->width;
    }
    else {
      local_58 = (FT_Bitmap_Size *)((long)(req->width * (ulong)req->horiResolution + 0x24) / 0x48);
    }
    h = (FT_Long)local_58;
    if (req->vertResolution == 0) {
      local_60 = (FT_Bitmap_Size *)req->height;
    }
    else {
      local_60 = (FT_Bitmap_Size *)((long)(req->height * (ulong)req->vertResolution + 0x24) / 0x48);
    }
    bsize = local_60;
    if ((req->width == 0) || (req->height != 0)) {
      if ((req->width == 0) && (req->height != 0)) {
        h = (FT_Long)local_60;
      }
    }
    else {
      bsize = local_58;
    }
    uVar1 = h + 0x20U & 0xffffffffffffffc0;
    if ((uVar1 == 0) || (((ulong)(bsize + 1) & 0xffffffffffffffc0) == 0)) {
      face_local._4_4_ = 0x17;
    }
    else {
      for (w._4_4_ = 0; w._4_4_ < face->num_fixed_sizes; w._4_4_ = w._4_4_ + 1) {
        if ((((ulong)(bsize + 1) & 0xffffffffffffffc0) ==
             (face->available_sizes[w._4_4_].y_ppem + 0x20U & 0xffffffffffffffc0)) &&
           ((uVar1 == (face->available_sizes[w._4_4_].x_ppem + 0x20U & 0xffffffffffffffc0) ||
            (ignore_width != '\0')))) {
          if (size_index != (FT_ULong *)0x0) {
            *size_index = (long)w._4_4_;
          }
          return 0;
        }
      }
      face_local._4_4_ = 0x17;
    }
  }
  else {
    face_local._4_4_ = 7;
  }
  return face_local._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Match_Size( FT_Face          face,
                 FT_Size_Request  req,
                 FT_Bool          ignore_width,
                 FT_ULong*        size_index )
  {
    FT_Int   i;
    FT_Long  w, h;


    if ( !FT_HAS_FIXED_SIZES( face ) )
      return FT_THROW( Invalid_Face_Handle );

    /* FT_Bitmap_Size doesn't provide enough info... */
    if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      return FT_THROW( Unimplemented_Feature );

    w = FT_REQUEST_WIDTH ( req );
    h = FT_REQUEST_HEIGHT( req );

    if ( req->width && !req->height )
      h = w;
    else if ( !req->width && req->height )
      w = h;

    w = FT_PIX_ROUND( w );
    h = FT_PIX_ROUND( h );

    if ( !w || !h )
      return FT_THROW( Invalid_Pixel_Size );

    for ( i = 0; i < face->num_fixed_sizes; i++ )
    {
      FT_Bitmap_Size*  bsize = face->available_sizes + i;


      if ( h != FT_PIX_ROUND( bsize->y_ppem ) )
        continue;

      if ( w == FT_PIX_ROUND( bsize->x_ppem ) || ignore_width )
      {
        FT_TRACE3(( "FT_Match_Size: bitmap strike %d matches\n", i ));

        if ( size_index )
          *size_index = (FT_ULong)i;

        return FT_Err_Ok;
      }
    }

    FT_TRACE3(( "FT_Match_Size: no matching bitmap strike\n" ));

    return FT_THROW( Invalid_Pixel_Size );
  }